

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ram_list_groups.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e35ba::Json2Array<aliyun::RamListGroupsGroupType>::Json2Array
          (Json2Array<aliyun::RamListGroupsGroupType> *this,Value *value,
          vector<aliyun::RamListGroupsGroupType,_std::allocator<aliyun::RamListGroupsGroupType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_a8 [8];
  RamListGroupsGroupType val;
  int i;
  vector<aliyun::RamListGroupsGroupType,_std::allocator<aliyun::RamListGroupsGroupType>_> *vec_local
  ;
  Value *value_local;
  Json2Array<aliyun::RamListGroupsGroupType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.update_date.field_2._12_4_ = 0; uVar1 = val.update_date.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.update_date.field_2._12_4_ = val.update_date.field_2._12_4_ + 1) {
      aliyun::RamListGroupsGroupType::RamListGroupsGroupType((RamListGroupsGroupType *)local_a8);
      value_00 = Json::Value::operator[](value,val.update_date.field_2._12_4_);
      anon_unknown.dwarf_e35ba::Json2Type(value_00,(RamListGroupsGroupType *)local_a8);
      std::vector<aliyun::RamListGroupsGroupType,_std::allocator<aliyun::RamListGroupsGroupType>_>::
      push_back(vec,(value_type *)local_a8);
      aliyun::RamListGroupsGroupType::~RamListGroupsGroupType((RamListGroupsGroupType *)local_a8);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }